

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_Test::
TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_Test
          (TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.repository_.
  _vptr_MockNamedValueComparatorsAndCopiersRepository = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.repository_.head_ =
       (MockNamedValueComparatorsAndCopiersRepositoryNode *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin.name_.bufferSize_ = 0;
  *(undefined8 *)&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin.enabled_
       = 0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin.next_ = (TestPlugin *)0x0
  ;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin.name_.buffer_ =
       (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin.super_TestPlugin._vptr_TestPlugin =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.output.bufferSize_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test = (UtestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput.progressIndication_ =
       (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.output.buffer_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput.dotCount_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput.verbose_ = level_quiet;
  *(undefined8 *)&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput.color_ =
       0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.super_TestOutput._vptr_TestOutput =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockPlugin::TEST_GROUP_CppUTestGroupMockPlugin
            (&this->super_TEST_GROUP_CppUTestGroupMockPlugin);
  (this->super_TEST_GROUP_CppUTestGroupMockPlugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockPlugin_002d4928;
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsWorksAlsoWithHierachicalObjects)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("differentScope::foobar")->onObject((void*) 1);
    MockExpectedObjectDidntHappenFailure expectedFailure(test, "differentScope::foobar", expectations);

    mock("differentScope").expectOneCall("foobar").onObject((void*) 1);
    mock("differentScope").actualCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    CHECK_NO_MOCK_FAILURE();
}